

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver_dpll_triad_simd.cc
# Opt level: O0

bool __thiscall
anon_unknown.dwarf_11362::GeneratorDpllTriadSimd::Minimize
          (GeneratorDpllTriadSimd *this,bool pencilmark,bool monotonic,char *puzzle)

{
  undefined1 uVar1;
  int iVar2;
  bool bVar3;
  reference piVar4;
  long in_RCX;
  byte in_DL;
  byte in_SIL;
  State *in_RDI;
  State state;
  char constraint;
  int cell_or_literal;
  iterator __end2;
  iterator __begin2;
  vector<int,_std::allocator<int>_> *__range2;
  vector<int,_std::allocator<int>_> permutation;
  bool restored_clue;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffb60;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *in_stack_fffffffffffffb68;
  undefined4 in_stack_fffffffffffffb78;
  undefined4 in_stack_fffffffffffffb7c;
  vector<int,_std::allocator<int>_> local_480;
  size_t in_stack_fffffffffffffba8;
  Util *in_stack_fffffffffffffbb0;
  State *in_stack_fffffffffffffbb8;
  State *in_stack_fffffffffffffc08;
  State *in_stack_fffffffffffffe90;
  char *in_stack_fffffffffffffe98;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_80;
  undefined1 *local_78;
  undefined1 local_70 [31];
  byte local_51;
  long local_50;
  byte local_42;
  byte local_41;
  byte local_31;
  
  local_41 = in_SIL & 1;
  local_42 = in_DL & 1;
  local_51 = 0;
  local_50 = in_RCX;
  Util::Permutation(in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8);
  local_78 = local_70;
  local_80._M_current =
       (int *)std::vector<int,_std::allocator<int>_>::begin(in_stack_fffffffffffffb60);
  std::vector<int,_std::allocator<int>_>::end(in_stack_fffffffffffffb60);
  do {
    bVar3 = __gnu_cxx::operator!=
                      (in_stack_fffffffffffffb68,
                       (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                       in_stack_fffffffffffffb60);
    if (!bVar3) {
      local_31 = 1;
LAB_0010e984:
      std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)CONCAT44(1,in_stack_fffffffffffffb78));
      return (bool)(local_31 & 1);
    }
    piVar4 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                       (&local_80);
    iVar2 = *piVar4;
    if ((local_41 & 1) == 0) {
      if ((iVar2 < 0x51) && (*(char *)(local_50 + iVar2) != '.')) goto LAB_0010e807;
    }
    else if (*(char *)(local_50 + iVar2) == '.') {
LAB_0010e807:
      uVar1 = *(undefined1 *)(local_50 + iVar2);
      State::State(in_stack_fffffffffffffc08);
      if ((local_41 & 1) == 0) {
        *(undefined1 *)(local_50 + iVar2) = 0x2e;
        SolverDpllTriadSimd<0>::InitVanillaByBand
                  ((char *)CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78),in_RDI);
      }
      else {
        *(char *)(local_50 + iVar2) =
             (char)iVar2 +
             ((char)(uint)((ulong)((long)iVar2 * 0x38e38e39) >> 0x21) - (char)(iVar2 >> 0x1f)) * -9
             + '1';
        SolverDpllTriadSimd<0>::InitPencilmarkByBox
                  (in_stack_fffffffffffffe98,in_stack_fffffffffffffe90);
      }
      in_stack_fffffffffffffb60 = &local_480;
      State::State(in_stack_fffffffffffffbb8,(State *)in_stack_fffffffffffffbb0);
      in_stack_fffffffffffffb68 =
           (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
           SolverDpllTriadSimd<0>::SafeCountSolutionsConsistentWithPartialAssignment
                     ((SolverDpllTriadSimd<0> *)
                      CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78),in_RDI,
                      (size_t)in_stack_fffffffffffffb68);
      if (in_stack_fffffffffffffb68 <
          (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)0x2) {
        if (((local_42 & 1) != 0) && ((local_51 & 1) != 0)) {
          local_31 = 0;
          goto LAB_0010e984;
        }
      }
      else {
        *(undefined1 *)(local_50 + iVar2) = uVar1;
        local_51 = 1;
      }
    }
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&local_80);
  } while( true );
}

Assistant:

bool Minimize(bool pencilmark, bool monotonic, char *puzzle) {
        bool restored_clue = false;
        vector<int> permutation = util_.Permutation(729);
        for (int cell_or_literal : permutation) {
            if (pencilmark) {
                if (puzzle[cell_or_literal] != '.') continue;
            } else {
                if (cell_or_literal >= 81 || puzzle[cell_or_literal] == '.') continue;
            }
            char constraint = puzzle[cell_or_literal];
            State state;
            if (pencilmark) {
                puzzle[cell_or_literal] = (char)('1' + (cell_or_literal % 9));
                SolverDpllTriadSimd<0>::InitPencilmarkByBox(puzzle, state);
            } else {
                puzzle[cell_or_literal] = '.';
                SolverDpllTriadSimd<0>::InitVanillaByBand(puzzle, state);
            }
            if (solver_.SafeCountSolutionsConsistentWithPartialAssignment(state, 2) > 1) {
                puzzle[cell_or_literal] = constraint;
                restored_clue = true;
            } else if (monotonic && restored_clue) {
                return false;
            }
        }
        return true;
    }